

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal64.c
# Opt level: O0

decimal64 * decimal64FromString(decimal64 *result,char *string,decContext *set)

{
  undefined1 local_54 [8];
  decNumber_conflict2 dn;
  decContext dc;
  decContext *set_local;
  char *string_local;
  decimal64 *result_local;
  
  decContextDefault((decContext *)(dn.lsu + 3),0x40);
  decNumberFromString((decNumber_conflict *)local_54,string,(decContext *)(dn.lsu + 3));
  decimal64FromNumber(result,(decNumber_conflict2 *)local_54,(decContext *)(dn.lsu + 3));
  if (dc.round != DEC_ROUND_CEILING) {
    decContextSetStatus(set,dc.round);
  }
  return result;
}

Assistant:

decimal64 * decimal64FromString(decimal64 *result, const char *string,
				decContext *set) {
  decContext dc;			     /* work */
  decNumber dn;				     /* .. */

  decContextDefault(&dc, DEC_INIT_DECIMAL64); /* no traps, please */
  dc.round=set->round;			      /* use supplied rounding */

  decNumberFromString(&dn, string, &dc);     /* will round if needed */

  decimal64FromNumber(result, &dn, &dc);
  if (dc.status!=0) {			     /* something happened */
    decContextSetStatus(set, dc.status);     /* .. pass it on */
    }
  return result;
  }